

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qringbuffer.cpp
# Opt level: O0

void __thiscall QRingChunk::allocate(QRingChunk *this,qsizetype alloc)

{
  long lVar1;
  bool bVar2;
  qsizetype qVar3;
  QByteArray *in_RSI;
  QByteArray *in_RDI;
  long in_FS_OFFSET;
  QByteArray *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  qVar3 = QByteArray::size(in_RDI);
  if ((qVar3 < (long)in_RSI) || (bVar2 = isShared((QRingChunk *)0x1748be), bVar2)) {
    QByteArray::QByteArray(this_00,(qsizetype)in_RSI,(Initialization)((ulong)in_RDI >> 0x20));
    QByteArray::operator=(in_RSI,in_RDI);
    QByteArray::~QByteArray((QByteArray *)0x1748ed);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QRingChunk::allocate(qsizetype alloc)
{
    Q_ASSERT(alloc > 0 && size() == 0);

    if (chunk.size() < alloc || isShared())
        chunk = QByteArray(alloc, Qt::Uninitialized);
}